

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<long>::Subst_Diag(TPZMatrix<long> *this,TPZFMatrix<long> *B)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int extraout_var_02;
  int64_t c;
  long lVar4;
  int64_t r;
  long lVar5;
  undefined8 local_38;
  
  lVar5 = (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  local_38 = in_RAX;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if (lVar5 != CONCAT44(extraout_var,iVar2)) {
    Error("TPZMatrix::Subst_Diag incompatible dimensions\n",(char *)0x0);
  }
  lVar5 = 0;
  while( true ) {
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    if (CONCAT44(extraout_var_00,iVar2) <= lVar5) break;
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar5)
    ;
    for (lVar4 = 0; lVar4 < (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol; lVar4 = lVar4 + 1)
    {
      iVar3 = (*(B->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                [0x24])(B,lVar5,lVar4);
      auVar1._4_4_ = extraout_var_02;
      auVar1._0_4_ = iVar3;
      auVar1._8_8_ = (long)extraout_var_02 >> 0x1f;
      local_38 = SUB168(auVar1 / SEXT816(CONCAT44(extraout_var_01,iVar2)),0);
      (*(B->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
                (B,lVar5,lVar4,&local_38);
    }
    lVar5 = lVar5 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}